

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

void __thiscall LogOutput::add(LogOutput *this)

{
  shared_ptr<LogOutput> sStack_18;
  
  std::mutex::lock(&sOutputsMutex);
  std::__shared_ptr<LogOutput,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<LogOutput,void>
            ((__shared_ptr<LogOutput,(__gnu_cxx::_Lock_policy)2> *)&sStack_18,
             (__weak_ptr<LogOutput,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<LogOutput>);
  std::
  _Rb_tree<std::shared_ptr<LogOutput>,std::shared_ptr<LogOutput>,std::_Identity<std::shared_ptr<LogOutput>>,std::less<std::shared_ptr<LogOutput>>,std::allocator<std::shared_ptr<LogOutput>>>
  ::_M_insert_unique<std::shared_ptr<LogOutput>const&>
            ((_Rb_tree<std::shared_ptr<LogOutput>,std::shared_ptr<LogOutput>,std::_Identity<std::shared_ptr<LogOutput>>,std::less<std::shared_ptr<LogOutput>>,std::allocator<std::shared_ptr<LogOutput>>>
              *)&sOutputs,&sStack_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_18.super___shared_ptr<LogOutput,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pthread_mutex_unlock((pthread_mutex_t *)&sOutputsMutex);
  return;
}

Assistant:

void LogOutput::add()
{
    std::lock_guard<std::mutex> lock(sOutputsMutex);
    sOutputs.insert(shared_from_this());
}